

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digit_comparison.h
# Opt level: O3

void fast_float::parse_mantissa<char>
               (bigint *result,parsed_number_string_t<char> *num,size_t max_digits,size_t *digits)

{
  limb *plVar1;
  size_t sVar2;
  byte bVar3;
  ushort uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  long *plVar9;
  ulong uVar10;
  long *plVar11;
  long *plVar12;
  size_t sVar13;
  ulong uVar14;
  bool bVar15;
  
  *digits = 0;
  plVar12 = (long *)(num->integer).ptr;
  sVar2 = (num->integer).length;
  plVar9 = (long *)((long)plVar12 + sVar2);
  sVar13 = sVar2;
  for (plVar11 = plVar12; (7 < (long)sVar13 && (*plVar11 == 0x3030303030303030));
      plVar11 = plVar11 + 1) {
    sVar13 = sVar13 - 8;
  }
  for (; plVar11 != plVar9; plVar11 = (long *)((long)plVar11 + 1)) {
    if ((char)*plVar11 != '0') {
      if (plVar11 != plVar9) {
        goto LAB_0012a7aa;
      }
      break;
    }
  }
  goto LAB_0012a92a;
LAB_0012a7aa:
  do {
    sVar13 = *digits;
    if ((long)plVar9 - (long)plVar11 < 8) {
      uVar5 = 0;
      uVar14 = 0;
    }
    else {
      pcVar8 = (char *)((long)plVar12 + ((sVar2 - 8) - (long)plVar11));
      uVar10 = max_digits - sVar13;
      bVar3 = 1;
      uVar14 = 0;
      uVar6 = 0;
      do {
        uVar5 = uVar6;
        if (uVar10 < 8) goto LAB_0012a87e;
        uVar6 = (*plVar11 + 0xcfcfcfcfcfcfcfd0U >> 8) + (*plVar11 + 0xcfcfcfcfcfcfcfd0U) * 10;
        uVar14 = ((uVar6 >> 0x10 & 0xff000000ff) * 0x271000000001 +
                  (uVar6 & 0xff000000ff) * 0xf424000000064 >> 0x20) + uVar14 * 100000000;
        plVar11 = plVar11 + 1;
        sVar13 = sVar13 + 8;
        *digits = sVar13;
        bVar15 = 7 < (long)pcVar8;
        pcVar8 = pcVar8 + -8;
        uVar10 = uVar10 - 8;
        bVar15 = (bool)(bVar15 & bVar3);
        bVar3 = 0;
        uVar6 = 8;
      } while (bVar15);
      uVar5 = uVar5 + 8;
    }
LAB_0012a87e:
    uVar6 = uVar5;
    if (sVar13 < max_digits && plVar11 != plVar9) {
      do {
        uVar14 = ((long)(char)*plVar11 + uVar14 * 10) - 0x30;
        plVar11 = (long *)((long)plVar11 + 1);
        uVar5 = uVar6 + 1;
        sVar13 = sVar13 + 1;
        *digits = sVar13;
        if ((0x11 < uVar6) || (plVar11 == plVar9)) break;
        uVar6 = uVar5;
      } while (sVar13 < max_digits);
    }
    bigint::mul(result,(&powers_of_ten_uint64)[uVar5]);
    if (sVar13 == max_digits) {
      if (uVar14 == 0) goto LAB_0012ac49;
      uVar4 = (result->vec).length;
      uVar5 = 0;
      goto LAB_0012ab92;
    }
    if (uVar14 != 0) {
      uVar4 = (result->vec).length;
      uVar5 = 0;
      do {
        if (uVar4 == uVar5) {
          if (uVar4 < 0x3e) {
            (result->vec).data[uVar4] = uVar14;
            (result->vec).length = uVar4 + 1;
          }
          break;
        }
        plVar1 = (result->vec).data + uVar5;
        bVar15 = CARRY8(*plVar1,uVar14);
        *plVar1 = *plVar1 + uVar14;
        uVar5 = uVar5 + 1;
        uVar14 = 1;
      } while (bVar15);
    }
  } while (plVar11 != plVar9);
LAB_0012a92a:
  plVar9 = (long *)(num->fraction).ptr;
  if (plVar9 == (long *)0x0) {
    return;
  }
  sVar2 = (num->fraction).length;
  plVar12 = (long *)((long)plVar9 + sVar2);
  plVar11 = plVar9;
  sVar13 = sVar2;
  if (*digits == 0) {
    for (; (7 < (long)sVar13 && (*plVar11 == 0x3030303030303030)); plVar11 = plVar11 + 1) {
      sVar13 = sVar13 - 8;
    }
    while( true ) {
      if (plVar11 == plVar12) {
        return;
      }
      if ((char)*plVar11 != '0') break;
      plVar11 = (long *)((long)plVar11 + 1);
    }
  }
  if (plVar11 == plVar12) {
    return;
  }
  do {
    sVar13 = *digits;
    if ((long)plVar12 - (long)plVar11 < 8) {
      uVar5 = 0;
      uVar14 = 0;
    }
    else {
      pcVar8 = (char *)((long)plVar9 + ((sVar2 - 8) - (long)plVar11));
      uVar10 = max_digits - sVar13;
      bVar3 = 1;
      uVar14 = 0;
      uVar6 = 0;
      do {
        uVar5 = uVar6;
        if (uVar10 < 8) goto LAB_0012aa50;
        uVar6 = (*plVar11 + 0xcfcfcfcfcfcfcfd0U >> 8) + (*plVar11 + 0xcfcfcfcfcfcfcfd0U) * 10;
        uVar14 = ((uVar6 >> 0x10 & 0xff000000ff) * 0x271000000001 +
                  (uVar6 & 0xff000000ff) * 0xf424000000064 >> 0x20) + uVar14 * 100000000;
        plVar11 = plVar11 + 1;
        sVar13 = sVar13 + 8;
        *digits = sVar13;
        bVar15 = 7 < (long)pcVar8;
        pcVar8 = pcVar8 + -8;
        uVar10 = uVar10 - 8;
        bVar15 = (bool)(bVar15 & bVar3);
        bVar3 = 0;
        uVar6 = 8;
      } while (bVar15);
      uVar5 = uVar5 + 8;
    }
LAB_0012aa50:
    uVar6 = uVar5;
    if (sVar13 < max_digits && plVar11 != plVar12) {
      do {
        uVar14 = ((long)(char)*plVar11 + uVar14 * 10) - 0x30;
        plVar11 = (long *)((long)plVar11 + 1);
        uVar5 = uVar6 + 1;
        sVar13 = sVar13 + 1;
        *digits = sVar13;
        if ((0x11 < uVar6) || (plVar11 == plVar12)) break;
        uVar6 = uVar5;
      } while (sVar13 < max_digits);
    }
    bigint::mul(result,(&powers_of_ten_uint64)[uVar5]);
    if (sVar13 == max_digits) {
      if (uVar14 == 0) goto LAB_0012abc3;
      uVar4 = (result->vec).length;
      uVar5 = 0;
      goto LAB_0012ab5f;
    }
    if (uVar14 != 0) {
      uVar4 = (result->vec).length;
      uVar5 = 0;
      do {
        if (uVar4 == uVar5) {
          if (uVar4 < 0x3e) {
            (result->vec).data[uVar4] = uVar14;
            (result->vec).length = uVar4 + 1;
          }
          break;
        }
        plVar1 = (result->vec).data + uVar5;
        bVar15 = CARRY8(*plVar1,uVar14);
        *plVar1 = *plVar1 + uVar14;
        uVar5 = uVar5 + 1;
        uVar14 = 1;
      } while (bVar15);
    }
    if (plVar11 == plVar12) {
      return;
    }
  } while( true );
  while( true ) {
    plVar1 = (result->vec).data + uVar5;
    bVar15 = CARRY8(*plVar1,uVar14);
    *plVar1 = *plVar1 + uVar14;
    uVar5 = uVar5 + 1;
    uVar14 = 1;
    if (!bVar15) break;
LAB_0012ab92:
    if (uVar4 == uVar5) {
      if (uVar4 < 0x3e) {
        (result->vec).data[uVar4] = uVar14;
        (result->vec).length = uVar4 + 1;
      }
      break;
    }
  }
LAB_0012ac49:
  for (lVar7 = (long)plVar9 - (long)plVar11; 7 < lVar7; lVar7 = lVar7 + -8) {
    if (*plVar11 != 0x3030303030303030) {
      bVar15 = true;
      goto LAB_0012acaa;
    }
    plVar11 = plVar11 + 1;
  }
  if (plVar11 == plVar9) {
    plVar9 = (long *)(num->fraction).ptr;
    if (plVar9 == (long *)0x0) {
      return;
    }
    bVar15 = false;
LAB_0012acb8:
    sVar2 = (num->fraction).length;
    plVar12 = plVar9;
    for (sVar13 = sVar2; 7 < (long)sVar13; sVar13 = sVar13 - 8) {
      if (*plVar12 != 0x3030303030303030) goto LAB_0012acfe;
      plVar12 = plVar12 + 1;
    }
    for (; plVar12 != (long *)((long)plVar9 + sVar2); plVar12 = (long *)((long)plVar12 + 1)) {
      if ((char)*plVar12 != '0') goto LAB_0012acfe;
    }
  }
  else {
    do {
      plVar12 = (long *)((long)plVar11 + 1);
      bVar15 = (char)*plVar11 != '0';
      if (bVar15) break;
      plVar11 = plVar12;
    } while (plVar12 != plVar9);
LAB_0012acaa:
    plVar9 = (long *)(num->fraction).ptr;
    if (plVar9 != (long *)0x0) goto LAB_0012acb8;
  }
  if (!bVar15) {
    return;
  }
LAB_0012acfe:
  bigint::mul(result,10);
  uVar4 = (result->vec).length;
  uVar14 = (ulong)uVar4;
  uVar5 = 0;
  do {
    if (uVar14 == uVar5) goto LAB_0012ad2a;
    plVar1 = (result->vec).data + uVar5;
    *plVar1 = *plVar1 + 1;
    uVar5 = uVar5 + 1;
  } while (*plVar1 == 0);
  goto LAB_0012ad41;
LAB_0012ad2a:
  if (uVar4 < 0x3e) {
    (result->vec).data[uVar14] = 1;
    (result->vec).length = uVar4 + 1;
  }
  goto LAB_0012ad41;
  while( true ) {
    plVar1 = (result->vec).data + uVar5;
    bVar15 = CARRY8(*plVar1,uVar14);
    *plVar1 = *plVar1 + uVar14;
    uVar5 = uVar5 + 1;
    uVar14 = 1;
    if (!bVar15) break;
LAB_0012ab5f:
    if (uVar4 == uVar5) {
      if (uVar4 < 0x3e) {
        (result->vec).data[uVar4] = uVar14;
        (result->vec).length = uVar4 + 1;
      }
      break;
    }
  }
LAB_0012abc3:
  for (lVar7 = (long)plVar12 - (long)plVar11; 7 < lVar7; lVar7 = lVar7 + -8) {
    if (*plVar11 != 0x3030303030303030) goto LAB_0012ac03;
    plVar11 = plVar11 + 1;
  }
  while( true ) {
    if (plVar11 == plVar12) {
      return;
    }
    if ((char)*plVar11 != '0') break;
    plVar11 = (long *)((long)plVar11 + 1);
  }
LAB_0012ac03:
  bigint::mul(result,10);
  uVar4 = (result->vec).length;
  uVar14 = (ulong)uVar4;
  uVar5 = 0;
  do {
    if (uVar14 == uVar5) goto LAB_0012ad2a;
    plVar1 = (result->vec).data + uVar5;
    *plVar1 = *plVar1 + 1;
    uVar5 = uVar5 + 1;
  } while (*plVar1 == 0);
LAB_0012ad41:
  *digits = *digits + 1;
  return;
}

Assistant:

inline FASTFLOAT_CONSTEXPR20
void parse_mantissa(bigint& result, parsed_number_string_t<UC>& num, size_t max_digits, size_t& digits) noexcept {
  // try to minimize the number of big integer and scalar multiplication.
  // therefore, try to parse 8 digits at a time, and multiply by the largest
  // scalar value (9 or 19 digits) for each step.
  size_t counter = 0;
  digits = 0;
  limb value = 0;
#ifdef FASTFLOAT_64BIT_LIMB
  size_t step = 19;
#else
  size_t step = 9;
#endif

  // process all integer digits.
  UC const * p = num.integer.ptr;
  UC const * pend = p + num.integer.len();
  skip_zeros(p, pend);
  // process all digits, in increments of step per loop
  while (p != pend) {
    while ((std::distance(p, pend) >= 8) && (step - counter >= 8) && (max_digits - digits >= 8)) {
      parse_eight_digits(p, value, counter, digits);
    }
    while (counter < step && p != pend && digits < max_digits) {
      parse_one_digit(p, value, counter, digits);
    }
    if (digits == max_digits) {
      // add the temporary value, then check if we've truncated any digits
      add_native(result, limb(powers_of_ten_uint64[counter]), value);
      bool truncated = is_truncated(p, pend);
      if (num.fraction.ptr != nullptr) {
        truncated |= is_truncated(num.fraction);
      }
      if (truncated) {
        round_up_bigint(result, digits);
      }
      return;
    } else {
      add_native(result, limb(powers_of_ten_uint64[counter]), value);
      counter = 0;
      value = 0;
    }
  }

  // add our fraction digits, if they're available.
  if (num.fraction.ptr != nullptr) {
    p = num.fraction.ptr;
    pend = p + num.fraction.len();
    if (digits == 0) {
      skip_zeros(p, pend);
    }
    // process all digits, in increments of step per loop
    while (p != pend) {
      while ((std::distance(p, pend) >= 8) && (step - counter >= 8) && (max_digits - digits >= 8)) {
        parse_eight_digits(p, value, counter, digits);
      }
      while (counter < step && p != pend && digits < max_digits) {
        parse_one_digit(p, value, counter, digits);
      }
      if (digits == max_digits) {
        // add the temporary value, then check if we've truncated any digits
        add_native(result, limb(powers_of_ten_uint64[counter]), value);
        bool truncated = is_truncated(p, pend);
        if (truncated) {
          round_up_bigint(result, digits);
        }
        return;
      } else {
        add_native(result, limb(powers_of_ten_uint64[counter]), value);
        counter = 0;
        value = 0;
      }
    }
  }

  if (counter != 0) {
    add_native(result, limb(powers_of_ten_uint64[counter]), value);
  }
}